

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall
QGraphicsScenePrivate::mousePressEventHandler
          (QGraphicsScenePrivate *this,QGraphicsSceneMouseEvent *mouseEvent)

{
  QList<QGraphicsItem_*> *this_00;
  QGraphicsScene *this_01;
  long lVar1;
  QGraphicsItem *pQVar2;
  QGraphicsItem **ppQVar3;
  long lVar4;
  QGraphicsItem **ppQVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  GraphicsItemFlags GVar9;
  FocusPolicy FVar10;
  PanelModality PVar11;
  MouseButtons MVar12;
  MouseButton MVar13;
  MouseButton MVar14;
  int iVar15;
  DragMode DVar16;
  KeyboardModifiers KVar17;
  QGraphicsScenePrivate *d;
  QWidget *pQVar18;
  QGraphicsWidget *widget;
  QGraphicsWidget *pQVar19;
  QGraphicsView *this_02;
  byte bVar20;
  long lVar21;
  long in_FS_OFFSET;
  QPointF QVar22;
  add_const_t<QList<QGraphicsItem_*>_> *__range1;
  QGraphicsItem *item;
  QGraphicsItem *topItem;
  QGraphicsItem *local_78;
  QPointF local_70;
  QPoint local_60;
  QArrayDataPointer<QGraphicsItem_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QGraphicsScene **)&this->field_0x8;
  (mouseEvent->super_QGraphicsSceneEvent).field_0xc = 0;
  lVar1 = (this->mouseGrabberItems).d.size;
  if (lVar1 == 0) {
    this_00 = &this->cachedItemsUnderMouse;
    if ((this->cachedItemsUnderMouse).d.size == 0) {
      local_60 = QGraphicsSceneMouseEvent::screenPos(mouseEvent);
      QVar22 = QGraphicsSceneMouseEvent::scenePos(mouseEvent);
      local_70.yp = QVar22.yp;
      local_70.xp = QVar22.xp;
      pQVar18 = QGraphicsSceneEvent::widget(&mouseEvent->super_QGraphicsSceneEvent);
      itemsAtPosition((QList<QGraphicsItem_*> *)&local_58,this,&local_60,&local_70,pQVar18);
      QArrayDataPointer<QGraphicsItem_*>::operator=(&this_00->d,&local_58);
      if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d)->super_QArrayData,8,0x10);
        }
      }
    }
    if ((this->cachedItemsUnderMouse).d.size == 0) {
      local_60.xp.m_i = 0;
      local_60.yp.m_i = 0;
    }
    else {
      local_60 = *(QPoint *)(this->cachedItemsUnderMouse).d.ptr;
    }
    if (local_60 == (QPoint)0x0) {
      widget = (QGraphicsWidget *)0x0;
    }
    else {
      widget = QGraphicsItem::window((QGraphicsItem *)local_60);
    }
    if (widget == (QGraphicsWidget *)0x0) {
LAB_006109da:
      widget = (QGraphicsWidget *)0x0;
    }
    else {
      bVar6 = QGraphicsItem::isBlockedByModalPanel
                        (&(widget->super_QGraphicsObject).super_QGraphicsItem,
                         (QGraphicsItem **)&local_60);
      if (bVar6) {
        if (local_60 == (QPoint)0x0) goto LAB_006109da;
        widget = QGraphicsItem::window((QGraphicsItem *)local_60);
      }
    }
    lVar1 = *(long *)(this_01 + 8);
    pQVar2 = *(QGraphicsItem **)(lVar1 + 0x1a8);
    if ((pQVar2 == (QGraphicsItem *)0x0) || (bVar6 = QGraphicsItem::isWindow(pQVar2), !bVar6)) {
      pQVar19 = (QGraphicsWidget *)0x0;
    }
    else {
      lVar1 = *(long *)(lVar1 + 0x1a8);
      pQVar19 = (QGraphicsWidget *)(lVar1 + -0x10);
      if (lVar1 == 0) {
        pQVar19 = (QGraphicsWidget *)0x0;
      }
    }
    if (widget != pQVar19) {
      QGraphicsScene::setActiveWindow(this_01,widget);
    }
    lVar1 = (this->cachedItemsUnderMouse).d.size;
    if (lVar1 == 0) {
      bVar6 = false;
    }
    else {
      ppQVar3 = (this->cachedItemsUnderMouse).d.ptr;
      lVar21 = 0;
      bVar8 = false;
      do {
        pQVar2 = *(QGraphicsItem **)((long)ppQVar3 + lVar21);
        bVar7 = QGraphicsItem::isBlockedByModalPanel(pQVar2,(QGraphicsItem **)0x0);
        bVar20 = 1;
        bVar6 = true;
        if (!bVar7) {
          if ((((pQVar2->d_ptr).d)->field_0x166 & 4) == 0) {
            bVar6 = QGraphicsItem::isEnabled(pQVar2);
            if (((!bVar6) ||
                (GVar9 = QGraphicsItem::flags(pQVar2),
                ((uint)GVar9.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
                       super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i & 4) == 0)) ||
               ((bVar6 = QGraphicsItem::isWidget(pQVar2), bVar6 &&
                (FVar10 = QGraphicsWidget::focusPolicy((QGraphicsWidget *)(pQVar2 + -1)),
                (FVar10 & ClickFocus) == NoFocus)))) {
              bVar7 = QGraphicsItem::isPanel(pQVar2);
              bVar6 = bVar8;
              if (!bVar7) {
                bVar20 = (((pQVar2->d_ptr).d)->field_0x166 & 2) >> 1;
              }
            }
            else {
              if (pQVar2 != *(QGraphicsItem **)
                             (*(long *)(this_01 + 8) + 0x188 +
                             (ulong)(*(int *)(*(long *)(this_01 + 8) + 0x1b8) < 1) * 0x10)) {
                bVar20 = 1;
                bVar6 = true;
                if ((((pQVar2->d_ptr).d)->field_0x168 & 2) == 0) goto LAB_00610ab4;
                QGraphicsItem::setFocus(pQVar2,MouseFocusReason);
              }
              bVar20 = 1;
              bVar6 = true;
            }
          }
          else {
            bVar6 = true;
          }
        }
LAB_00610ab4:
      } while ((bVar20 == 0) &&
              (bVar7 = lVar1 * 8 + -8 != lVar21, lVar21 = lVar21 + 8, bVar8 = bVar6, bVar7));
    }
    lVar1 = (this->modalPanels).d.size;
    if (lVar1 == 0) {
      bVar8 = false;
    }
    else {
      ppQVar3 = (this->modalPanels).d.ptr;
      lVar21 = 0;
      do {
        PVar11 = QGraphicsItem::panelModality(*(QGraphicsItem **)((long)ppQVar3 + lVar21));
        bVar8 = false;
        if (PVar11 == SceneModal) {
          bVar8 = true;
          break;
        }
        bVar7 = lVar1 * 8 + -8 != lVar21;
        lVar21 = lVar21 + 8;
      } while (bVar7);
    }
    if ((((byte)this->field_0xb9 >> 1 & 1) == 0 && !bVar6) && (!bVar8)) {
      setFocusItemHelper(*(QGraphicsScenePrivate **)(this_01 + 8),(QGraphicsItem *)0x0,
                         MouseFocusReason,true);
    }
    if ((bVar8) && ((this->cachedItemsUnderMouse).d.size == 0)) {
      local_58.d = (Data *)*(this->modalPanels).d.ptr;
      QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
                ((QPodArrayOps<QGraphicsItem*> *)this_00,0,(QGraphicsItem **)&local_58);
      QList<QGraphicsItem_*>::end(this_00);
    }
    lVar1 = (this->cachedItemsUnderMouse).d.size;
    if (lVar1 != 0) {
      ppQVar3 = (this->cachedItemsUnderMouse).d.ptr;
      lVar21 = 0;
      do {
        local_78 = *(QGraphicsItem **)((long)ppQVar3 + lVar21);
        MVar12 = QGraphicsItem::acceptedMouseButtons(local_78);
        MVar13 = QGraphicsSceneMouseEvent::button(mouseEvent);
        if ((MVar13 & (uint)MVar12.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
                            super_QFlagsStorage<Qt::MouseButton>.i) == NoButton) {
          iVar15 = 7;
        }
        else {
          QGraphicsItem::isBlockedByModalPanel(local_78,&local_78);
          grabMouse(this,local_78,true);
          (mouseEvent->super_QGraphicsSceneEvent).field_0xc = 1;
          bVar6 = QGraphicsItem::isEnabled(local_78);
          bVar8 = QGraphicsItem::isPanel(local_78);
          if ((*(short *)&(mouseEvent->super_QGraphicsSceneEvent).field_0x8 == 0x9e) &&
             (this->lastMouseGrabberItem != (QGraphicsItem *)0x0 &&
              local_78 != this->lastMouseGrabberItem)) {
            local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_58.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
            QGraphicsSceneMouseEvent::QGraphicsSceneMouseEvent
                      ((QGraphicsSceneMouseEvent *)&local_58,GraphicsSceneMousePress);
            ppQVar5 = local_58.ptr;
            local_58.ptr._5_3_ = SUB83(ppQVar5,5);
            local_58.ptr._0_5_ =
                 CONCAT14(1,CONCAT13((mouseEvent->super_QGraphicsSceneEvent).field_0xb,
                                     local_58.ptr._0_3_));
            MVar13 = QGraphicsSceneMouseEvent::button(mouseEvent);
            QGraphicsSceneMouseEvent::setButton((QGraphicsSceneMouseEvent *)&local_58,MVar13);
            MVar12 = QGraphicsSceneMouseEvent::buttons(mouseEvent);
            QGraphicsSceneMouseEvent::setButtons((QGraphicsSceneMouseEvent *)&local_58,MVar12);
            local_70.xp = (qreal)QGraphicsSceneMouseEvent::screenPos(mouseEvent);
            QGraphicsSceneMouseEvent::setScreenPos
                      ((QGraphicsSceneMouseEvent *)&local_58,(QPoint *)&local_70);
            QVar22 = QGraphicsSceneMouseEvent::scenePos(mouseEvent);
            local_70.yp = QVar22.yp;
            local_70.xp = QVar22.xp;
            QGraphicsSceneMouseEvent::setScenePos((QGraphicsSceneMouseEvent *)&local_58,&local_70);
            KVar17 = QGraphicsSceneMouseEvent::modifiers(mouseEvent);
            QGraphicsSceneMouseEvent::setModifiers((QGraphicsSceneMouseEvent *)&local_58,KVar17);
            pQVar18 = QGraphicsSceneEvent::widget(&mouseEvent->super_QGraphicsSceneEvent);
            QGraphicsSceneEvent::setWidget((QGraphicsSceneEvent *)&local_58,pQVar18);
            MVar13 = QGraphicsSceneMouseEvent::button(mouseEvent);
            MVar14 = QGraphicsSceneMouseEvent::button(mouseEvent);
            QVar22 = QGraphicsSceneMouseEvent::buttonDownPos(mouseEvent,MVar14);
            local_70.yp = QVar22.yp;
            local_70.xp = QVar22.xp;
            QGraphicsSceneMouseEvent::setButtonDownPos
                      ((QGraphicsSceneMouseEvent *)&local_58,MVar13,&local_70);
            MVar13 = QGraphicsSceneMouseEvent::button(mouseEvent);
            MVar14 = QGraphicsSceneMouseEvent::button(mouseEvent);
            QVar22 = QGraphicsSceneMouseEvent::buttonDownScenePos(mouseEvent,MVar14);
            local_70.yp = QVar22.yp;
            local_70.xp = QVar22.xp;
            QGraphicsSceneMouseEvent::setButtonDownScenePos
                      ((QGraphicsSceneMouseEvent *)&local_58,MVar13,&local_70);
            MVar13 = QGraphicsSceneMouseEvent::button(mouseEvent);
            MVar14 = QGraphicsSceneMouseEvent::button(mouseEvent);
            local_70.xp = (qreal)QGraphicsSceneMouseEvent::buttonDownScreenPos(mouseEvent,MVar14);
            QGraphicsSceneMouseEvent::setButtonDownScreenPos
                      ((QGraphicsSceneMouseEvent *)&local_58,MVar13,(QPoint *)&local_70);
            sendMouseEvent(this,(QGraphicsSceneMouseEvent *)&local_58);
            (**(code **)(*(long *)&mouseEvent->super_QGraphicsSceneEvent + 0x10))
                      (mouseEvent,local_58.ptr._4_1_);
            QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)&local_58);
          }
          else {
            sendMouseEvent(this,mouseEvent);
          }
          lVar4 = (this->mouseGrabberItems).d.size;
          if (lVar4 == 0) {
            bVar7 = true;
          }
          else {
            bVar7 = (this->mouseGrabberItems).d.ptr[lVar4 + -1] != local_78;
          }
          if (bVar6) {
            if ((mouseEvent->super_QGraphicsSceneEvent).field_0xc == '\x01') {
              if (lVar4 != 0) {
                storeMouseButtonsForMouseGrabber(this,mouseEvent);
              }
              this->lastMouseGrabberItem = local_78;
              iVar15 = 1;
            }
            else {
              ungrabMouse(this,local_78,bVar7);
              iVar15 = 0;
              if (bVar8) {
                iVar15 = 6;
              }
            }
          }
          else {
            ungrabMouse(this,local_78,bVar7);
            iVar15 = 6;
          }
        }
        if ((iVar15 != 7) && (iVar15 != 0)) goto LAB_00610ef3;
        lVar21 = lVar21 + 8;
      } while (lVar1 << 3 != lVar21);
      iVar15 = 6;
LAB_00610ef3:
      if (iVar15 != 6) goto LAB_00610f8e;
    }
    if ((mouseEvent->super_QGraphicsSceneEvent).field_0xc == '\0') {
      if ((this->mouseGrabberItems).d.size != 0) {
        QGraphicsItem::ungrabMouse(*(this->mouseGrabberItems).d.ptr);
      }
      this->lastMouseGrabberItem = (QGraphicsItem *)0x0;
      pQVar18 = QGraphicsSceneEvent::widget(&mouseEvent->super_QGraphicsSceneEvent);
      bVar6 = false;
      if (pQVar18 == (QWidget *)0x0) {
        this_02 = (QGraphicsView *)0x0;
      }
      else {
        QGraphicsSceneEvent::widget(&mouseEvent->super_QGraphicsSceneEvent);
        this_02 = (QGraphicsView *)QMetaObject::cast((QObject *)&QGraphicsView::staticMetaObject);
      }
      if (this_02 != (QGraphicsView *)0x0) {
        DVar16 = QGraphicsView::dragMode(this_02);
        bVar6 = DVar16 == ScrollHandDrag;
      }
      KVar17 = QGraphicsSceneMouseEvent::modifiers(mouseEvent);
      if (((uint)KVar17.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                 super_QFlagsStorage<Qt::KeyboardModifier>.i >> 0x1a & 1) == 0 && !bVar6) {
        QGraphicsScene::clearSelection(this_01);
      }
    }
  }
  else {
    bVar6 = QGraphicsItem::isBlockedByModalPanel
                      ((this->mouseGrabberItems).d.ptr[lVar1 + -1],(QGraphicsItem **)0x0);
    if (!bVar6) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        sendMouseEvent(this,mouseEvent);
        return;
      }
      goto LAB_00610fad;
    }
  }
LAB_00610f8e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00610fad:
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::mousePressEventHandler(QGraphicsSceneMouseEvent *mouseEvent)
{
    Q_Q(QGraphicsScene);

    // Ignore by default, unless we find a mouse grabber that accepts it.
    mouseEvent->ignore();

    // Deliver to any existing mouse grabber.
    if (!mouseGrabberItems.isEmpty()) {
        if (mouseGrabberItems.constLast()->isBlockedByModalPanel())
            return;
        // The event is ignored by default, but we disregard the event's
        // accepted state after delivery; the mouse is grabbed, after all.
        sendMouseEvent(mouseEvent);
        return;
    }

    // Start by determining the number of items at the current position.
    // Reuse value from earlier calculations if possible.
    if (cachedItemsUnderMouse.isEmpty()) {
        cachedItemsUnderMouse = itemsAtPosition(mouseEvent->screenPos(),
                                                mouseEvent->scenePos(),
                                                mouseEvent->widget());
    }

    // Update window activation.
    QGraphicsItem *topItem = cachedItemsUnderMouse.value(0);
    QGraphicsWidget *newActiveWindow = topItem ? topItem->window() : nullptr;
    if (newActiveWindow && newActiveWindow->isBlockedByModalPanel(&topItem)) {
        // pass activation to the blocking modal window
        newActiveWindow = topItem ? topItem->window() : nullptr;
    }

    if (newActiveWindow != q->activeWindow())
        q->setActiveWindow(newActiveWindow);

    // Set focus on the topmost enabled item that can take focus.
    bool setFocus = false;

    for (QGraphicsItem *item : std::as_const(cachedItemsUnderMouse)) {
        if (item->isBlockedByModalPanel()
            || (item->d_ptr->flags & QGraphicsItem::ItemStopsFocusHandling)) {
            // Make sure we don't clear focus.
            setFocus = true;
            break;
        }
        if (item->isEnabled() && ((item->flags() & QGraphicsItem::ItemIsFocusable))) {
            if (!item->isWidget() || ((QGraphicsWidget *)item)->focusPolicy() & Qt::ClickFocus) {
                setFocus = true;
                if (item != q->focusItem() && item->d_ptr->mouseSetsFocus)
                    q->setFocusItem(item, Qt::MouseFocusReason);
                break;
            }
        }
        if (item->isPanel())
            break;
        if (item->d_ptr->flags & QGraphicsItem::ItemStopsClickFocusPropagation)
            break;
    }

    // Check for scene modality.
    bool sceneModality = false;
    for (auto modalPanel : std::as_const(modalPanels)) {
        if (modalPanel->panelModality() == QGraphicsItem::SceneModal) {
            sceneModality = true;
            break;
        }
    }

    // If nobody could take focus, clear it.
    if (!stickyFocus && !setFocus && !sceneModality)
        q->setFocusItem(nullptr, Qt::MouseFocusReason);

    // Any item will do.
    if (sceneModality && cachedItemsUnderMouse.isEmpty())
        cachedItemsUnderMouse << modalPanels.constFirst();

    // Find a mouse grabber by sending mouse press events to all mouse grabber
    // candidates one at a time, until the event is accepted. It's accepted by
    // default, so the receiver has to explicitly ignore it for it to pass
    // through.
    for (QGraphicsItem *item : std::as_const(cachedItemsUnderMouse)) {
        if (!(item->acceptedMouseButtons() & mouseEvent->button())) {
            // Skip items that don't accept the event's mouse button.
            continue;
        }

        // Check if this item is blocked by a modal panel and deliver the mouse event to the
        // blocking panel instead of this item if blocked.
        (void) item->isBlockedByModalPanel(&item);

        grabMouse(item, /* implicit = */ true);
        mouseEvent->accept();

        // check if the item we are sending to are disabled (before we send the event)
        bool disabled = !item->isEnabled();
        bool isPanel = item->isPanel();
        if (mouseEvent->type() == QEvent::GraphicsSceneMouseDoubleClick
            && item != lastMouseGrabberItem && lastMouseGrabberItem) {
            // If this item is different from the item that received the last
            // mouse event, and mouseEvent is a double-click event, then the
            // event is converted to a press. Known limitation:
            // Triple-clicking will not generate a double-click, though.
            QGraphicsSceneMouseEvent mousePress(QEvent::GraphicsSceneMousePress);
            mousePress.m_spont = mouseEvent->spontaneous();
            mousePress.accept();
            mousePress.setButton(mouseEvent->button());
            mousePress.setButtons(mouseEvent->buttons());
            mousePress.setScreenPos(mouseEvent->screenPos());
            mousePress.setScenePos(mouseEvent->scenePos());
            mousePress.setModifiers(mouseEvent->modifiers());
            mousePress.setWidget(mouseEvent->widget());
            mousePress.setButtonDownPos(mouseEvent->button(),
                                        mouseEvent->buttonDownPos(mouseEvent->button()));
            mousePress.setButtonDownScenePos(mouseEvent->button(),
                                             mouseEvent->buttonDownScenePos(mouseEvent->button()));
            mousePress.setButtonDownScreenPos(mouseEvent->button(),
                                              mouseEvent->buttonDownScreenPos(mouseEvent->button()));
            sendMouseEvent(&mousePress);
            mouseEvent->setAccepted(mousePress.isAccepted());
        } else {
            sendMouseEvent(mouseEvent);
        }

        bool dontSendUngrabEvents = mouseGrabberItems.isEmpty() || mouseGrabberItems.constLast() != item;
        if (disabled) {
            ungrabMouse(item, /* itemIsDying = */ dontSendUngrabEvents);
            break;
        }
        if (mouseEvent->isAccepted()) {
            if (!mouseGrabberItems.isEmpty())
                storeMouseButtonsForMouseGrabber(mouseEvent);
            lastMouseGrabberItem = item;
            return;
        }
        ungrabMouse(item, /* itemIsDying = */ dontSendUngrabEvents);

        // Don't propagate through panels.
        if (isPanel)
            break;
    }

    // Is the event still ignored? Then the mouse press goes to the scene.
    // Reset the mouse grabber, clear the selection, clear focus, and leave
    // the event ignored so that it can propagate through the originating
    // view.
    if (!mouseEvent->isAccepted()) {
        clearMouseGrabber();

        QGraphicsView *view = mouseEvent->widget() ? qobject_cast<QGraphicsView *>(mouseEvent->widget()->parentWidget()) : 0;
        bool dontClearSelection = view && view->dragMode() == QGraphicsView::ScrollHandDrag;
        bool extendSelection = (mouseEvent->modifiers() & Qt::ControlModifier) != 0;
        dontClearSelection |= extendSelection;
        if (!dontClearSelection) {
            // Clear the selection if the originating view isn't in scroll
            // hand drag mode. The view will clear the selection if no drag
            // happened.
            q->clearSelection();
        }
    }
}